

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  string_view val;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  long lVar7;
  reference pcVar8;
  string *psVar9;
  string local_2810 [32];
  undefined1 local_27f0 [8];
  ostringstream cmCTestLog_msg_17;
  string local_2678 [32];
  undefined1 local_2658 [8];
  ostringstream cmCTestLog_msg_16;
  string local_24e0 [32];
  undefined1 local_24c0 [8];
  ostringstream cmCTestLog_msg_15;
  cmDuration local_2348;
  undefined1 local_2340 [8];
  cmXMLWriter xml;
  undefined1 local_22c8 [8];
  ostringstream cmCTestLog_msg_14;
  undefined1 local_2150 [8];
  cmGeneratedFileStream xofs;
  cmCTestBuildErrorWarning *evit_1;
  iterator __end2_5;
  iterator __begin2_5;
  t_ErrorsAndWarningsVector *__range2_5;
  cmCTestBuildErrorWarning *evit;
  iterator __end2_4;
  iterator __begin2_4;
  t_ErrorsAndWarningsVector *__range2_4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1ea0;
  type elapsed_build_time;
  string local_1e90;
  string local_1e70 [32];
  undefined1 local_1e50 [8];
  ostringstream cmCTestLog_msg_13;
  int local_1cd4;
  int local_1cd0;
  int res;
  int retVal;
  allocator<char> local_1ca1;
  string local_1ca0;
  undefined1 local_1c80 [8];
  cmStringReplaceHelper colorRemover;
  string local_1b20;
  allocator<char> local_1af9;
  string local_1af8;
  string local_1ad8;
  undefined1 local_1ab8 [8];
  string bindir;
  string local_1a90;
  string local_1a70;
  allocator<char> local_1a49;
  string local_1a48;
  string local_1a28;
  undefined1 local_1a08 [8];
  string srcdir;
  string local_19e0;
  string local_19c0;
  string local_19a0 [32];
  undefined1 local_1980 [8];
  ostringstream cmCTestLog_msg_12;
  string *s_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  ostringstream local_17c8 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1650 [32];
  undefined1 local_1630 [8];
  ostringstream cmCTestLog_msg_10;
  string *s_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  ostringstream local_1478 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1300 [32];
  undefined1 local_12e0 [8];
  ostringstream cmCTestLog_msg_8;
  string *s_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  ostringstream local_1128 [8];
  ostringstream cmCTestLog_msg_7;
  string local_fb0 [32];
  undefined1 local_f90 [8];
  ostringstream cmCTestLog_msg_6;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream local_dd8 [8];
  ostringstream cmCTestLog_msg_5;
  long local_c60;
  size_type cc;
  undefined1 local_c38 [8];
  ostringstream cmCTestLog_msg_4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_ac0;
  time_point elapsed_time_start;
  cmGeneratedFileStream ofs;
  allocator<char> local_839;
  string local_838;
  string local_818;
  string *local_7f8;
  string *useLaunchers;
  undefined1 local_7d0 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_651;
  string local_650;
  string local_630;
  string *local_610;
  string *buildDirectory;
  string local_600 [32];
  undefined1 local_5e0 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_468 [8];
  string makeCommand;
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_2b0 [8];
  cmCTestCompileErrorWarningRex r;
  int entry;
  duration<double,_std::ratio<1L,_1L>_> local_1c8;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBuildHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Build project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x126,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_1c8.__r =
       (rep_conflict)cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  r.RegularExpression._204_4_ = 2;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,std::ratio<60l,1l>> *)&entry,(int *)&r.RegularExpression.field_0xcc);
  bVar2 = std::chrono::operator<(&local_1c8,(duration<long,_std::ratio<60L,_1L>_> *)&entry);
  if (bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    r.RegularExpression.progsize = 0;
    while (cmCTestWarningErrorFileLine[r.RegularExpression.progsize].RegularExpressionString !=
           (char *)0x0) {
      cmCTestCompileErrorWarningRex::cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2b0);
      bVar2 = cmsys::RegularExpression::compile
                        ((RegularExpression *)&r,
                         cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                         RegularExpressionString);
      if (bVar2) {
        local_2b0._0_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].FileIndex;
        local_2b0._4_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].LineIndex;
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)local_2b0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        poVar3 = std::operator<<((ostream *)local_428,"Problem Compiling regular expression: ");
        poVar3 = std::operator<<(poVar3,cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                                        RegularExpressionString);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x13b,pcVar4,false);
        std::__cxx11::string::~string((string *)(makeCommand.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      }
      cmCTestCompileErrorWarningRex::~cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_2b0);
      r.RegularExpression.progsize = r.RegularExpression.progsize + 1;
    }
    GetMakeCommand_abi_cxx11_((string *)local_468,this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"BuildDirectory",&local_651);
      cmCTest::GetCTestConfiguration(&local_630,pcVar1,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      local_610 = &local_630;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"UseLaunchers",&local_839);
        cmCTest::GetCTestConfiguration(&local_818,pcVar1,&local_838);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator(&local_839);
        local_7f8 = &local_818;
        val = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_7f8);
        bVar2 = cmIsOn(val);
        this->UseCTestLaunch = bVar2;
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&elapsed_time_start,None);
        local_ac0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar2 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)&elapsed_time_start);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c38);
          poVar3 = std::operator<<((ostream *)local_c38,"Cannot create build log file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x15a,pcVar4,false);
          std::__cxx11::string::~string((string *)&cc);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c38);
        }
        for (local_c60 = 0; cmCTestErrorMatches[local_c60] != (char *)0x0; local_c60 = local_c60 + 1
            ) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,cmCTestErrorMatches + local_c60);
        }
        for (local_c60 = 0; cmCTestErrorExceptions[local_c60] != (char *)0x0;
            local_c60 = local_c60 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,cmCTestErrorExceptions + local_c60);
        }
        for (local_c60 = 0; cmCTestWarningMatches[local_c60] != (char *)0x0;
            local_c60 = local_c60 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,cmCTestWarningMatches + local_c60);
        }
        for (local_c60 = 0; cmCTestWarningExceptions[local_c60] != (char *)0x0;
            local_c60 = local_c60 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,cmCTestWarningExceptions + local_c60);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_dd8);
        poVar3 = (ostream *)std::ostream::operator<<(local_dd8,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17e,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2);
        std::__cxx11::ostringstream::~ostringstream(local_dd8);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CustomErrorMatches);
        s = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CustomErrorMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&s), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f90);
          poVar3 = std::operator<<((ostream *)local_f90,"Add this->CustomErrorMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x17e,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_fb0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f90);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1128);
        poVar3 = (ostream *)std::ostream::operator<<(local_1128,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x180,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::ostringstream::~ostringstream(local_1128);
        __end2_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomErrorExceptions);
        s_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomErrorExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_1), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12e0);
          poVar3 = std::operator<<((ostream *)local_12e0,"Add this->CustomErrorExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x180,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1300);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12e0);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_1);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_1478);
        poVar3 = (ostream *)std::ostream::operator<<(local_1478,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x182,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_2);
        std::__cxx11::ostringstream::~ostringstream(local_1478);
        __end2_2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningMatches);
        s_2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_2), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1630);
          poVar3 = std::operator<<((ostream *)local_1630,"Add this->CustomWarningMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x182,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1650);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1630);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_17c8);
        poVar3 = (ostream *)std::ostream::operator<<(local_17c8,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x184,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_3);
        std::__cxx11::ostringstream::~ostringstream(local_17c8);
        __end2_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningExceptions);
        s_3 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_3), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_3);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1980);
          poVar3 = std::operator<<((ostream *)local_1980,"Add this->CustomWarningExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x184,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_19a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1980);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_3);
        }
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_19e0,"SourceDirectory",
                   (allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_19c0,pcVar1,&local_19e0);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_19c0);
        std::__cxx11::string::~string((string *)&local_19e0);
        std::allocator<char>::~allocator((allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a48,"SourceDirectory",&local_1a49);
          cmCTest::GetCTestConfiguration(&local_1a28,pcVar1,&local_1a48);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a08,&local_1a28,"/");
          std::__cxx11::string::~string((string *)&local_1a28);
          std::__cxx11::string::~string((string *)&local_1a48);
          std::allocator<char>::~allocator(&local_1a49);
          std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::rfind((char)local_1a08,0x2f);
          if (lVar7 != -1) {
            std::__cxx11::string::resize((ulong)local_1a08);
            std::__cxx11::string::operator=((string *)&this->SimplifySourceDir,(string *)local_1a08)
            ;
          }
          std::__cxx11::string::~string((string *)local_1a08);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a90,"BuildDirectory",
                   (allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1a70,pcVar1,&local_1a90);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1a70);
        std::__cxx11::string::~string((string *)&local_1a90);
        std::allocator<char>::~allocator((allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1af8,"BuildDirectory",&local_1af9);
          cmCTest::GetCTestConfiguration(&local_1ad8,pcVar1,&local_1af8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1ab8,&local_1ad8,"/");
          std::__cxx11::string::~string((string *)&local_1ad8);
          std::__cxx11::string::~string((string *)&local_1af8);
          std::allocator<char>::~allocator(&local_1af9);
          std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::rfind((char)local_1ab8,0x2f);
          if (lVar7 != -1) {
            std::__cxx11::string::resize((ulong)local_1ab8);
            std::__cxx11::string::operator=((string *)&this->SimplifyBuildDir,(string *)local_1ab8);
          }
          std::__cxx11::string::~string((string *)local_1ab8);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_1b20,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&local_1b20);
        std::__cxx11::string::~string((string *)&local_1b20);
        colorRemover.Makefile = (cmMakefile *)std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = (rep)colorRemover.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1ca0,"\x1b\\[[0-9;]*m",&local_1ca1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&retVal,"",(allocator<char> *)((long)&res + 3));
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)local_1c80,&local_1ca0,(string *)&retVal,
                   (cmMakefile *)0x0);
        std::__cxx11::string::~string((string *)&retVal);
        std::allocator<char>::~allocator((allocator<char> *)((long)&res + 3));
        std::__cxx11::string::~string((string *)&local_1ca0);
        std::allocator<char>::~allocator(&local_1ca1);
        this->ColorRemover = (cmStringReplaceHelper *)local_1c80;
        local_1cd0 = 0;
        local_1cd4 = 4;
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e50);
          poVar3 = std::operator<<((ostream *)local_1e50,"Build with command: ");
          poVar3 = std::operator<<(poVar3,(string *)local_468);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ac,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1e70);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e50);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          local_1cd4 = RunMakeCommand(this,(string *)local_468,&local_1cd0,pcVar4,0,
                                      (ostream *)&elapsed_time_start,Auto);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_1e90,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&local_1e90);
        std::__cxx11::string::~string((string *)&local_1e90);
        elapsed_build_time.__r = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = elapsed_build_time.__r;
        __range2_4 = (t_ErrorsAndWarningsVector *)std::chrono::_V2::steady_clock::now();
        local_1ea0.__r =
             (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&__range2_4,&local_ac0);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_4 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit = (cmCTestBuildErrorWarning *)
                 std::
                 vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_4,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit), bVar2) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator*(&__end2_4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->Text,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PreContext,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PostContext,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_4);
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_5 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit_1 = (cmCTestBuildErrorWarning *)
                   std::
                   vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_5,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit_1), bVar2) {
            xofs._608_8_ = __gnu_cxx::
                           __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                           ::operator*(&__end2_5);
            psVar9 = &((reference)xofs._608_8_)->Text;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._608_8_ + 0x70);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._608_8_ + 0x90);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_5);
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2150,None);
        bVar2 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_2150);
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2340,(ostream *)local_2150,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_2340);
          if ((this->UseCTestLaunch & 1U) == 0) {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_2340);
          }
          else {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_2340);
          }
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_2348,&local_1ea0);
          GenerateXMLFooter(this,(cmXMLWriter *)local_2340,local_2348);
          if (((local_1cd4 != 4) || (local_1cd0 != 0)) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_24c0);
            poVar3 = std::operator<<((ostream *)local_24c0,"Error(s) when building project");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1de,pcVar4,false);
            std::__cxx11::string::~string(local_24e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_24c0);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2658);
          poVar3 = std::operator<<((ostream *)local_2658,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalErrors);
          pcVar4 = "";
          if (this->MaxErrors <= this->TotalErrors) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler errors");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e5,pcVar4,false);
          std::__cxx11::string::~string(local_2678);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2658);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27f0);
          poVar3 = std::operator<<((ostream *)local_27f0,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalWarnings);
          pcVar4 = "";
          if (this->MaxWarnings <= this->TotalWarnings) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler warnings");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ea,pcVar4,false);
          std::__cxx11::string::~string(local_2810);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27f0);
          this_local._4_4_ = local_1cd0;
          buildDirectory._4_4_ = 1;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2340);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_22c8);
          poVar3 = std::operator<<((ostream *)local_22c8,"Cannot create build XML file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d0,pcVar4,false);
          std::__cxx11::string::~string((string *)&xml.ElementOpen);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_22c8);
          this_local._4_4_ = -1;
          buildDirectory._4_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2150);
        cmStringReplaceHelper::~cmStringReplaceHelper((cmStringReplaceHelper *)local_1c80);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_818);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7d0);
        poVar3 = std::operator<<((ostream *)local_7d0,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x14d,pcVar4,false);
        std::__cxx11::string::~string((string *)&useLaunchers);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7d0);
        this_local._4_4_ = -1;
        buildDirectory._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&local_630);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e0);
      poVar3 = std::operator<<((ostream *)local_5e0,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x144,pcVar4,false);
      std::__cxx11::string::~string(local_600);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e0);
      this_local._4_4_ = -1;
      buildDirectory._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_468);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}